

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

void LZ4_resetStream_fast(LZ4_stream_t *ctx)

{
  void *in_RDI;
  
  if ((*(int *)((long)in_RDI + 0x4004) != 0) &&
     ((*(int *)((long)in_RDI + 0x4004) != 2 || (0x40000000 < *(uint *)((long)in_RDI + 0x4000))))) {
    memset(in_RDI,0,0x4000);
    *(undefined4 *)((long)in_RDI + 0x4000) = 0;
    *(undefined4 *)((long)in_RDI + 0x4004) = 0;
  }
  if (*(int *)((long)in_RDI + 0x4000) != 0) {
    *(int *)((long)in_RDI + 0x4000) = *(int *)((long)in_RDI + 0x4000) + 0x10000;
  }
  *(undefined8 *)((long)in_RDI + 0x4010) = 0;
  *(undefined8 *)((long)in_RDI + 0x4008) = 0;
  *(undefined4 *)((long)in_RDI + 0x4018) = 0;
  return;
}

Assistant:

void LZ4_resetStream_fast(LZ4_stream_t* ctx) {
    LZ4_prepareTable(&(ctx->internal_donotuse), 0, byU32);
}